

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sha1-sw.c
# Opt level: O3

void sha1_sw_write(BinarySink *bs,void *vp,size_t len)

{
  _func_void_BinarySink_ptr_char_ptr___va_list_tag_ptr *p_Var1;
  uint uVar2;
  size_t t;
  long lVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  ulong __n;
  uint32_t w [80];
  uint auStack_1b8 [5];
  uint local_1a4;
  uint local_1a0;
  uint local_19c;
  uint local_198 [2];
  BinarySink **local_190;
  undefined8 local_188;
  undefined8 local_180;
  uint local_178 [82];
  
  if (len != 0) {
    local_190 = &bs[-4].binarysink_;
    do {
      __n = 0x40 - (long)bs[-1].writefmtv;
      if (len < __n) {
        __n = len;
      }
      auStack_1b8[2] = 0x16390d;
      auStack_1b8[3] = 0;
      local_188 = vp;
      local_180 = len;
      memcpy(bs[-1].writefmtv + (long)local_190,vp,__n);
      p_Var1 = bs[-1].writefmtv;
      bs[-1].writefmtv = p_Var1 + __n;
      bs[-1].binarysink_ = (BinarySink *)((long)&(bs[-1].binarysink_)->write + __n);
      if (p_Var1 + __n == (_func_void_BinarySink_ptr_char_ptr___va_list_tag_ptr *)0x40) {
        bs[-1].writefmtv = (_func_void_BinarySink_ptr_char_ptr___va_list_tag_ptr *)0x0;
        lVar3 = 0;
        do {
          uVar4 = *(uint *)((long)bs + lVar3 * 4 + -0x50);
          local_178[lVar3] =
               uVar4 >> 0x18 | (uVar4 & 0xff0000) >> 8 | (uVar4 & 0xff00) << 8 | uVar4 << 0x18;
          lVar3 = lVar3 + 1;
        } while (lVar3 != 0x10);
        lVar3 = 0x10;
        do {
          uVar4 = local_198[lVar3] ^ *(uint *)((long)&local_188 + lVar3 * 4 + 4) ^
                  auStack_1b8[lVar3 + 2] ^ auStack_1b8[lVar3];
          local_178[lVar3] = uVar4 << 1 | (uint)((int)uVar4 < 0);
          lVar3 = lVar3 + 1;
        } while (lVar3 != 0x50);
        local_1a4 = *(uint *)&bs[-5].binarysink_;
        local_1a0 = *(uint *)((long)&bs[-5].binarysink_ + 4);
        local_19c = *(uint *)&bs[-4].write;
        local_198[0] = *(uint *)((long)&bs[-4].write + 4);
        local_198[1] = *(uint *)&bs[-4].writefmtv;
        lVar3 = 0x10;
        uVar4 = local_1a4;
        uVar2 = local_1a0;
        uVar6 = local_19c;
        uVar9 = local_198[0];
        uVar5 = local_198[1];
        do {
          uVar7 = uVar2 << 0x1e | uVar2 >> 2;
          uVar2 = (uVar4 << 5 | uVar4 >> 0x1b) + uVar5 + ((uVar6 ^ uVar9) & uVar2 ^ uVar9) +
                  *(int *)((long)&local_188 + lVar3) + 0x5a827999;
          uVar8 = uVar4 << 0x1e | uVar4 >> 2;
          uVar4 = uVar9 + *(int *)((long)&local_188 + lVar3 + 4) + ((uVar7 ^ uVar6) & uVar4 ^ uVar6)
                  + 0x5a827999 + (uVar2 * 0x20 | uVar2 >> 0x1b);
          uVar6 = uVar6 + *(int *)((long)local_178 + lVar3 + -8) + ((uVar8 ^ uVar7) & uVar2 ^ uVar7)
                  + 0x5a827999 + (uVar4 * 0x20 | uVar4 >> 0x1b);
          uVar5 = uVar2 * 0x40000000 | uVar2 >> 2;
          uVar2 = uVar7 + *(int *)((long)local_178 + lVar3 + -4) + ((uVar5 ^ uVar8) & uVar4 ^ uVar8)
                  + 0x5a827999 + (uVar6 * 0x20 | uVar6 >> 0x1b);
          uVar9 = uVar4 * 0x40000000 | uVar4 >> 2;
          uVar4 = uVar8 + *(int *)((long)local_178 + lVar3) + ((uVar9 ^ uVar5) & uVar6 ^ uVar5) +
                  0x5a827999 + (uVar2 * 0x20 | uVar2 >> 0x1b);
          uVar6 = uVar6 * 0x40000000 | uVar6 >> 2;
          lVar3 = lVar3 + 0x14;
        } while (lVar3 != 0x60);
        lVar3 = 0x60;
        do {
          uVar7 = (uVar4 << 5 | uVar4 >> 0x1b) + uVar5 + (uVar6 ^ uVar9 ^ uVar2) +
                  *(int *)((long)&local_188 + lVar3) + 0x6ed9eba1;
          uVar2 = uVar2 << 0x1e | uVar2 >> 2;
          uVar8 = uVar4 << 0x1e | uVar4 >> 2;
          uVar4 = (uVar4 ^ uVar6 ^ uVar2) + uVar9 + *(int *)((long)&local_188 + lVar3 + 4) +
                  0x6ed9eba1 + (uVar7 * 0x20 | uVar7 >> 0x1b);
          uVar5 = uVar7 * 0x40000000 | uVar7 >> 2;
          uVar6 = uVar6 + *(int *)((long)local_178 + lVar3 + -8) + (uVar8 ^ uVar2 ^ uVar7) +
                  0x6ed9eba1 + (uVar4 * 0x20 | uVar4 >> 0x1b);
          uVar9 = uVar4 * 0x40000000 | uVar4 >> 2;
          uVar2 = uVar2 + *(int *)((long)local_178 + lVar3 + -4) + (uVar5 ^ uVar8 ^ uVar4) +
                  0x6ed9eba1 + (uVar6 * 0x20 | uVar6 >> 0x1b);
          uVar4 = uVar8 + *(int *)((long)local_178 + lVar3) + (uVar9 ^ uVar5 ^ uVar6) + 0x6ed9eba1 +
                  (uVar2 * 0x20 | uVar2 >> 0x1b);
          uVar6 = uVar6 * 0x40000000 | uVar6 >> 2;
          lVar3 = lVar3 + 0x14;
        } while (lVar3 != 0xb0);
        lVar3 = 0xb0;
        do {
          uVar7 = uVar2 << 0x1e | uVar2 >> 2;
          uVar2 = ((uVar2 | uVar6) & uVar9 | uVar2 & uVar6) + 0x8f1bbcdc +
                  (uVar4 << 5 | uVar4 >> 0x1b) + uVar5 + *(int *)((long)&local_188 + lVar3);
          uVar9 = uVar9 + *(int *)((long)&local_188 + lVar3 + 4) +
                  ((uVar7 | uVar4) & uVar6 | uVar7 & uVar4) + -0x70e44324 +
                  (uVar2 * 0x20 | uVar2 >> 0x1b);
          uVar4 = uVar4 << 0x1e | uVar4 >> 2;
          uVar6 = uVar6 + *(int *)((long)local_178 + lVar3 + -8) +
                  ((uVar2 | uVar4) & uVar7 | uVar2 & uVar4) + -0x70e44324 +
                  (uVar9 * 0x20 | uVar9 >> 0x1b);
          uVar5 = uVar2 * 0x40000000 | uVar2 >> 2;
          uVar2 = uVar7 + *(int *)((long)local_178 + lVar3 + -4) +
                  ((uVar9 | uVar5) & uVar4 | uVar9 & uVar5) + -0x70e44324 +
                  (uVar6 * 0x20 | uVar6 >> 0x1b);
          uVar9 = uVar9 * 0x40000000 | uVar9 >> 2;
          uVar4 = uVar4 + *(int *)((long)local_178 + lVar3) +
                  ((uVar6 | uVar9) & uVar5 | uVar6 & uVar9) + -0x70e44324 +
                  (uVar2 * 0x20 | uVar2 >> 0x1b);
          uVar6 = uVar6 * 0x40000000 | uVar6 >> 2;
          lVar3 = lVar3 + 0x14;
        } while (lVar3 != 0x100);
        lVar3 = 0x100;
        do {
          uVar7 = (uVar4 << 5 | uVar4 >> 0x1b) + uVar5 + (uVar6 ^ uVar9 ^ uVar2) +
                  *(int *)((long)&local_188 + lVar3) + 0xca62c1d6;
          uVar2 = uVar2 << 0x1e | uVar2 >> 2;
          uVar8 = uVar4 << 0x1e | uVar4 >> 2;
          uVar4 = (uVar4 ^ uVar6 ^ uVar2) + uVar9 + *(int *)((long)&local_188 + lVar3 + 4) +
                  -0x359d3e2a + (uVar7 * 0x20 | uVar7 >> 0x1b);
          uVar5 = uVar7 * 0x40000000 | uVar7 >> 2;
          uVar6 = uVar6 + *(int *)((long)local_178 + lVar3 + -8) + (uVar8 ^ uVar2 ^ uVar7) +
                  -0x359d3e2a + (uVar4 * 0x20 | uVar4 >> 0x1b);
          uVar9 = uVar4 * 0x40000000 | uVar4 >> 2;
          uVar2 = uVar2 + *(int *)((long)local_178 + lVar3 + -4) + (uVar5 ^ uVar8 ^ uVar4) +
                  -0x359d3e2a + (uVar6 * 0x20 | uVar6 >> 0x1b);
          uVar4 = uVar8 + *(int *)((long)local_178 + lVar3) + (uVar9 ^ uVar5 ^ uVar6) + -0x359d3e2a
                  + (uVar2 * 0x20 | uVar2 >> 0x1b);
          uVar6 = uVar6 * 0x40000000 | uVar6 >> 2;
          lVar3 = lVar3 + 0x14;
        } while (lVar3 != 0x150);
        *(uint *)&bs[-5].binarysink_ = uVar4 + local_1a4;
        *(uint *)((long)&bs[-5].binarysink_ + 4) = uVar2 + local_1a0;
        *(uint *)&bs[-4].write = uVar6 + local_19c;
        *(uint *)((long)&bs[-4].write + 4) = uVar9 + local_198[0];
        *(uint *)&bs[-4].writefmtv = uVar5 + local_198[1];
        auStack_1b8[2] = 0x163cc2;
        auStack_1b8[3] = 0;
        smemclr(local_178,0x140);
      }
      vp = (void *)((long)local_188 + __n);
      len = local_180 - __n;
    } while (len != 0);
  }
  return;
}

Assistant:

static void sha1_sw_write(BinarySink *bs, const void *vp, size_t len)
{
    sha1_sw *s = BinarySink_DOWNCAST(bs, sha1_sw);

    while (len > 0)
        if (sha1_block_write(&s->blk, &vp, &len))
            sha1_sw_block(s->core, s->blk.block);
}